

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O0

void __thiscall
StringWriter_ReadThreeByteLengthCharString_Test::~StringWriter_ReadThreeByteLengthCharString_Test
          (StringWriter_ReadThreeByteLengthCharString_Test *this)

{
  StringWriter_ReadThreeByteLengthCharString_Test *this_local;
  
  anon_unknown.dwarf_228fb::StringWriter::~StringWriter(&this->super_StringWriter);
  return;
}

Assistant:

TEST_F (StringWriter, ReadThreeByteLengthCharString) {
    auto const src_length = three_byte_varint;
    auto const src_char = 'a';

    // Produce a serialized string of 'length' character 'a's.
    {
        auto output_it = std::back_inserter (bytes_);
        pstore::varint::encode (src_length, output_it);
        std::generate_n (output_it, src_length,
                         [src_char] () { return static_cast<std::uint8_t> (src_char); });
    }

    auto archive = pstore::serialize::archive::make_reader (std::begin (writer_));
    std::string const actual = pstore::serialize::read<std::string> (archive);
    std::string const expected (src_length, src_char);
    EXPECT_EQ (expected, actual);
    EXPECT_EQ (std::end (writer_), archive.iterator ());
}